

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_sints(Impl *this,Value *ints,int32_t **out_sints)

{
  SizeType SVar1;
  int iVar2;
  int *piVar3;
  ConstValueIterator pGVar4;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *local_38;
  ConstValueIterator itr;
  int *ret;
  int *s32s;
  int32_t **out_sints_local;
  Value *ints_local;
  Impl *this_local;
  
  SVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::Size(ints);
  piVar3 = ScratchAllocator::allocate_n<int>(&this->allocator,(ulong)SVar1);
  local_38 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::Begin(ints);
  ret = piVar3;
  while( true ) {
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::End(ints);
    if (local_38 == pGVar4) break;
    iVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetInt(local_38);
    *ret = iVar2;
    local_38 = local_38 + 1;
    ret = ret + 1;
  }
  *out_sints = piVar3;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_sints(const Value &ints, const int32_t **out_sints)
{
	auto *s32s = allocator.allocate_n<int32_t>(ints.Size());
	auto *ret = s32s;
	for (auto itr = ints.Begin(); itr != ints.End(); ++itr, s32s++)
		*s32s = itr->GetInt();

	*out_sints = ret;
	return true;
}